

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O2

void MapOptHandler_cluster(FMapInfoParser *parse,level_info_t *info)

{
  int *piVar1;
  cluster_info_t *this;
  cluster_info_t *pcVar2;
  int iVar3;
  uint uVar4;
  
  FMapInfoParser::ParseAssign(parse);
  FScanner::MustGetNumber(&parse->sc);
  iVar3 = (parse->sc).Number;
  info->cluster = iVar3;
  iVar3 = FindWadClusterInfo(iVar3);
  if (iVar3 == -1) {
    uVar4 = TArray<cluster_info_t,_cluster_info_t>::Reserve(&wadclusterinfos,1);
    pcVar2 = wadclusterinfos.Array;
    this = wadclusterinfos.Array + uVar4;
    cluster_info_t::Reset(this);
    pcVar2[uVar4].cluster = (parse->sc).Number;
    if (parse->HexenHack == true) {
      piVar1 = &this->flags;
      *(byte *)piVar1 = (byte)*piVar1 | 1;
    }
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(cluster, true)
{
	parse.ParseAssign();
	parse.sc.MustGetNumber();
	info->cluster = parse.sc.Number;

	// If this cluster hasn't been defined yet, add it. This is especially needed
	// for Hexen, because it doesn't have clusterdefs. If we don't do this, every
	// level on Hexen will sometimes be considered as being on the same hub,
	// depending on the check done.
	if (FindWadClusterInfo (parse.sc.Number) == -1)
	{
		unsigned int clusterindex = wadclusterinfos.Reserve(1);
		cluster_info_t *clusterinfo = &wadclusterinfos[clusterindex];
		clusterinfo->Reset();
		clusterinfo->cluster = parse.sc.Number;
		if (parse.HexenHack)
		{
			clusterinfo->flags |= CLUSTER_HUB;
		}
	}
}